

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void Luv32toLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  int16_t *luv3;
  
  if (0 < n) {
    puVar2 = (uint *)sp->tbuf;
    lVar3 = n + 1;
    do {
      uVar1 = *puVar2;
      *(short *)op = (short)(uVar1 >> 0x10);
      *(short *)(op + 2) =
           (short)(int)(((double)(uVar1 >> 8 & 0xff) + 0.5) * 0.0024390243902439024 * 32768.0);
      *(short *)(op + 4) =
           (short)(int)(((double)(uVar1 & 0xff) + 0.5) * 0.0024390243902439024 * 32768.0);
      op = op + 6;
      puVar2 = puVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

static void Luv32toLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        double u, v;

        *luv3++ = (int16_t)(*luv >> 16);
        u = 1. / UVSCALE * ((*luv >> 8 & 0xff) + .5);
        v = 1. / UVSCALE * ((*luv & 0xff) + .5);
        *luv3++ = (int16_t)(u * (1L << 15));
        *luv3++ = (int16_t)(v * (1L << 15));
        luv++;
    }
}